

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  IRIns *pIVar4;
  IRIns *pIVar5;
  byte bVar6;
  TRef TVar7;
  IRRef1 *pIVar8;
  ulong uVar9;
  
  TVar7 = 0;
  if ((((J->fold).left[0].field_1.t.irt & 0x40) == 0) && ((J->flags & 0x800000) != 0)) {
    pIVar8 = J->chain + 10;
    uVar1 = (J->fold).ins.field_0.op1;
    while( true ) {
      if (*pIVar8 <= uVar1) {
        uVar2 = (J->cur).nins;
        uVar9 = (ulong)uVar2;
        if (J->irtoplim <= uVar2) {
          lj_ir_growtop(J);
        }
        (J->cur).nins = uVar2 + 1;
        pIVar4 = (J->cur).ir;
        bVar6 = (J->fold).ins.field_1.o;
        *(IRRef1 *)((long)pIVar4 + uVar9 * 8 + 6) = J->chain[bVar6];
        J->chain[bVar6] = (IRRef1)uVar2;
        *(byte *)((long)pIVar4 + uVar9 * 8 + 5) = bVar6;
        pIVar4[uVar9].field_0.op1 = (J->fold).ins.field_0.op1;
        *(IRRef1 *)((long)pIVar4 + uVar9 * 8 + 2) = (J->fold).ins.field_0.op2;
        iVar3 = *(int *)((long)&(J->fold).ins + 4);
        bVar6 = (byte)iVar3;
        (J->guardemit).irt = (J->guardemit).irt | bVar6;
        *(byte *)((long)pIVar4 + uVar9 * 8 + 4) = bVar6;
        return iVar3 * 0x1000000 + uVar2;
      }
      pIVar5 = (J->cur).ir;
      pIVar4 = pIVar5 + *pIVar8;
      if (((pIVar4->field_0).op1 == uVar1) && (-1 < (long)(short)(pIVar4->field_0).op2)) break;
      pIVar8 = &(pIVar4->field_0).prev;
    }
    TVar7 = 4;
    if (pIVar5[(short)(pIVar4->field_0).op2].field_1.op12 < (J->fold).right[0].field_1.op12) {
      (pIVar4->field_0).op2 = (J->fold).ins.field_0.op2;
    }
  }
  return TVar7;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  PHIBARRIER(fleft);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	uint32_t k = (uint32_t)IR(ir->op2)->i;
	if ((uint32_t)fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}